

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::Stream::write_format<int,char_const*>(Stream *this,char *fmt,int *args,char **args_1)

{
  undefined8 uVar1;
  int iVar2;
  pointer pvVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator_type local_859;
  undefined1 local_858 [8];
  vector<char,_std::allocator<char>_> glowable_buf;
  size_t n;
  int sn;
  array<char,_2048UL> buf;
  int bufsiz;
  char **args_local_1;
  int *args_local;
  char *fmt_local;
  Stream *this_local;
  
  buf._M_elems[0x7f8] = '\0';
  buf._M_elems[0x7f9] = '\b';
  buf._M_elems[0x7fa] = '\0';
  buf._M_elems[0x7fb] = '\0';
  unique0x10000257 = args_1;
  pvVar3 = std::array<char,_2048UL>::data((array<char,_2048UL> *)((long)&n + 4));
  sVar4 = std::array<char,_2048UL>::size((array<char,_2048UL> *)((long)&n + 4));
  n._0_4_ = snprintf(pvVar3,sVar4 - 1,fmt,(ulong)(uint)*args,*stack0xffffffffffffffd0);
  if ((int)n < 1) {
    this_local = (Stream *)(long)(int)n;
  }
  else {
    uVar5 = (ulong)(int)n;
    glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = uVar5;
    sVar4 = std::array<char,_2048UL>::size((array<char,_2048UL> *)((long)&n + 4));
    if (uVar5 < sVar4 - 1) {
      pvVar3 = std::array<char,_2048UL>::data((array<char,_2048UL> *)((long)&n + 4));
      iVar2 = (*this->_vptr_Stream[5])
                        (this,pvVar3,
                         glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
                        );
      this_local = (Stream *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      sVar4 = std::array<char,_2048UL>::size((array<char,_2048UL> *)((long)&n + 4));
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_858,sVar4,&local_859);
      std::allocator<char>::~allocator(&local_859);
      while( true ) {
        uVar1 = glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
        sVar4 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_858);
        if ((ulong)uVar1 < sVar4 - 1) break;
        sVar4 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_858);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_858,sVar4 * 2);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_858,0);
        sVar4 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_858);
        iVar2 = snprintf(pvVar6,sVar4 - 1,fmt,(ulong)(uint)*args,*stack0xffffffffffffffd0);
        glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = SEXT48(iVar2);
      }
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_858,0);
      iVar2 = (*this->_vptr_Stream[5])
                        (this,pvVar6,
                         glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
                        );
      this_local = (Stream *)CONCAT44(extraout_var,iVar2);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_858);
    }
  }
  return (ssize_t)this_local;
}

Assistant:

inline ssize_t Stream::write_format(const char *fmt, const Args &... args) {
		const auto bufsiz = 2048;
		std::array<char, bufsiz> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
		auto sn = _snprintf_s(buf.data(), bufsiz - 1, buf.size() - 1, fmt, args...);
#else
		auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
		if (sn <= 0) { return sn; }

		auto n = static_cast<size_t>(sn);

		if (n >= buf.size() - 1) {
			std::vector<char> glowable_buf(buf.size());

			while (n >= glowable_buf.size() - 1) {
				glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
				n = static_cast<size_t>(_snprintf_s(&glowable_buf[0], glowable_buf.size(),
                                          glowable_buf.size() - 1, fmt,
                                          args...));
#else
				n = static_cast<size_t>(
						snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
#endif
			}
			return write(&glowable_buf[0], n);
		} else {
			return write(buf.data(), n);
		}
	}